

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O2

bool __thiscall
SharedMemRingBuffer::RegisterConsumer(SharedMemRingBuffer *this,int id,int64_t *index_for_customer)

{
  atomic<int> *paVar1;
  long lVar2;
  StatusOnSharedMem *pSVar3;
  __int_type_conflict _Var4;
  
  if (this->ring_buffer_status_on_shared_mem_->array_consumer_indexes[id].super___atomic_base<long>.
      _M_i == -1) {
    LOCK();
    paVar1 = &this->ring_buffer_status_on_shared_mem_->registered_consumer_count;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    if (199 < (this->ring_buffer_status_on_shared_mem_->registered_consumer_count).
              super___atomic_base<int>._M_i) {
      return false;
    }
    pSVar3 = this->ring_buffer_status_on_shared_mem_;
    if ((this->ring_buffer_status_on_shared_mem_->cursor).super___atomic_base<long>._M_i < 0) {
      _Var4 = 0;
    }
    else {
      _Var4 = (pSVar3->cursor).super___atomic_base<long>._M_i;
      pSVar3 = this->ring_buffer_status_on_shared_mem_;
    }
    LOCK();
    pSVar3->array_consumer_indexes[id].super___atomic_base<long>._M_i = _Var4;
    UNLOCK();
    lVar2 = this->ring_buffer_status_on_shared_mem_->array_consumer_indexes[id].
            super___atomic_base<long>._M_i;
  }
  else {
    lVar2 = this->ring_buffer_status_on_shared_mem_->array_consumer_indexes[id].
            super___atomic_base<long>._M_i + 1;
  }
  *index_for_customer = lVar2;
  return true;
}

Assistant:

bool SharedMemRingBuffer::RegisterConsumer (int id, int64_t* index_for_customer)
{
    if(ring_buffer_status_on_shared_mem_->array_consumer_indexes[id] == -1 ) {
        //처음 등록 
        ring_buffer_status_on_shared_mem_->registered_consumer_count++;
        if( ring_buffer_status_on_shared_mem_->registered_consumer_count >= MAX_CONSUMER) {
            DEBUG_ELOG("Error: Exceeds MAX_CONSUMER : " << MAX_CONSUMER); 
            return false;
        }

        if(ring_buffer_status_on_shared_mem_->cursor >= 0 ) {
            DEBUG_LOG("cursor >= 0"); 
            //데이터 전달 중이데 새로운 소비자가 추가
            ring_buffer_status_on_shared_mem_->array_consumer_indexes[id] = 
                ring_buffer_status_on_shared_mem_->cursor.load() ; 
        } else {
            DEBUG_LOG("set 0 "); 
            ring_buffer_status_on_shared_mem_->array_consumer_indexes[id] = 0; 
        }

        *index_for_customer = ring_buffer_status_on_shared_mem_->array_consumer_indexes[id];
    } else {
        //last read message index 
        //기존 최종 업데이트 했던 인덱스 + 1 돌려준다. consumer가 호출할 인덱스 이므로 ..
        *index_for_customer = ring_buffer_status_on_shared_mem_->array_consumer_indexes[id] + 1;
    }
    DEBUG_LOG("USAGE_CONSUMER ID : " << id<< " / index : "<< *index_for_customer); 
    return true;
}